

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_lowmc.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint iter;
  picnic_params_t params;
  char **in_stack_000002e0;
  int in_stack_000002ec;
  uint in_stack_00001480;
  picnic_params_t in_stack_00001484;
  tuple<picnic_params_t,_unsigned_int> *in_stack_ffffffffffffffc8;
  tuple<picnic_params_t_&,_unsigned_int_&> *in_stack_ffffffffffffffd0;
  picnic_params_t *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  undefined4 local_4;
  
  parse_args(in_stack_000002ec,in_stack_000002e0);
  std::tie<picnic_params_t,unsigned_int>
            (in_stack_ffffffffffffffd8,(uint *)in_stack_ffffffffffffffd0);
  std::tuple<picnic_params_t&,unsigned_int&>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_14 != 0) {
    anon_unknown.dwarf_12ff7::bench_lowmc(in_stack_00001484,in_stack_00001480);
  }
  local_4 = (uint)(local_14 == 0);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  picnic_params_t params;
  unsigned int iter;
  std::tie(params, iter) = parse_args(argc, argv);
  if (params == PARAMETER_SET_INVALID) {
    return 1;
  }

  bench_lowmc(params, iter);
  return 0;
}